

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Socket::Socket(Socket *this,type stype)

{
  int iVar1;
  runtime_error *this_00;
  
  this->SocketFileDescriptor = -1;
  (this->RemoteIp)._M_dataplus._M_p = (pointer)&(this->RemoteIp).field_2;
  (this->RemoteIp)._M_string_length = 0;
  (this->RemoteIp).field_2._M_local_buf[0] = '\0';
  iVar1 = 6;
  if (stype == UDP) {
    iVar1 = 0x11;
  }
  iVar1 = socket(2,(stype == UDP) + 1,iVar1);
  this->SocketFileDescriptor = iVar1;
  if (iVar1 != -1) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"system error - socket() failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Socket::Socket(Socket::type stype) {
  auto type = (stype == Socket::type::UDP) ? SOCK_DGRAM : SOCK_STREAM;
  auto proto = (stype == Socket::type::UDP) ? IPPROTO_UDP : IPPROTO_TCP;

  if ((SocketFileDescriptor = socket(AF_INET, type, proto)) == -1) {
    //LOG(IPC, Sev::Error, "socket() failed");
    throw std::runtime_error("system error - socket() failed");
  }
}